

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O0

void test_requirements<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>>(void)

{
  undefined1 local_c8 [8];
  unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> lk_2;
  unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> lk_1;
  lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> local_98;
  lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> lk;
  basic_shared_timed_mutex<yamc::rwlock::TaskFairness> mtx;
  
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *)&lk);
  std::lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::lock_guard
            (&local_98,(basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *)&lk);
  std::lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~lock_guard
            (&local_98);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::unique_lock
            ((unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> *)
             &lk_2._M_owns,(mutex_type *)&lk);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~unique_lock
            ((unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> *)
             &lk_2._M_owns);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::unique_lock
            ((unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> *)
             local_c8,&lk);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~unique_lock
            ((unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> *)
             local_c8);
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *)&lk);
  return;
}

Assistant:

void test_requirements()
{
  Mutex mtx;
  // Mutex::lock(), unlock()
  {
    std::lock_guard<Mutex> lk(mtx);
  }
  {
    std::unique_lock<Mutex> lk(mtx);
  }
  // Mutex::try_lock()
  {
    std::unique_lock<Mutex> lk(mtx, std::try_to_lock);
  }
}